

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O2

void __thiscall OpenMD::Snapshot::clearDerivedProperties(Snapshot *this)

{
  double local_80;
  RectMatrix<double,_3U,_3U> local_78;
  Vector<double,_3U> local_30;
  
  (this->frameData).excludedPotential = 0.0;
  (this->frameData).selfPotential = 0.0;
  (this->frameData).totalEnergy = 0.0;
  (this->frameData).translationalKinetic = 0.0;
  (this->frameData).rotationalKinetic = 0.0;
  (this->frameData).electronicKinetic = 0.0;
  (this->frameData).kineticEnergy = 0.0;
  (this->frameData).potentialEnergy = 0.0;
  (this->frameData).shortRangePotential = 0.0;
  (this->frameData).longRangePotential = 0.0;
  (this->frameData).pressure = 0.0;
  (this->frameData).temperature = 0.0;
  RectMatrix<double,_3U,_3U>::RectMatrix(&local_78,0.0);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&(this->frameData).pressureTensor,&local_78);
  local_80 = 0.0;
  Vector<double,_3U>::Vector(&local_30,&local_80);
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_78,&local_30);
  Vector<double,_3U>::operator=
            (&(this->frameData).systemDipole.super_Vector<double,_3U>,
             (Vector<double,_3U> *)&local_78);
  RectMatrix<double,_3U,_3U>::RectMatrix(&local_78,0.0);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&(this->frameData).systemQuadrupole,&local_78);
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_78);
  local_78.data_[0][0] = 0.0;
  local_78.data_[0][1] = 0.0;
  local_78.data_[0][2] = 0.0;
  Vector<double,_3U>::operator=
            (&(this->frameData).convectiveHeatFlux.super_Vector<double,_3U>,
             (Vector<double,_3U> *)&local_78);
  (this->frameData).electronicTemperature = 0.0;
  (this->frameData).netCharge = 0.0;
  (this->frameData).chargeMomentum = 0.0;
  Vector<double,_3U>::operator=
            (&(this->frameData).COM.super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  Vector<double,_3U>::operator=
            (&(this->frameData).COMvel.super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero
            );
  Vector<double,_3U>::operator=
            (&(this->frameData).COMw.super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  this->hasTotalEnergy = false;
  this->hasTranslationalKineticEnergy = false;
  this->hasRotationalKineticEnergy = false;
  this->hasElectronicKineticEnergy = false;
  this->hasKineticEnergy = false;
  this->hasShortRangePotential = false;
  this->hasLongRangePotential = false;
  this->hasExcludedPotential = false;
  this->hasSelfPotential = false;
  this->hasPotentialEnergy = false;
  this->hasXYarea = false;
  this->hasXZarea = false;
  this->hasYZarea = false;
  this->hasVolume = false;
  this->hasPressure = false;
  this->hasTemperature = false;
  this->hasPressure = false;
  this->hasTemperature = false;
  this->hasElectronicTemperature = false;
  this->hasNetCharge = false;
  this->hasChargeMomentum = false;
  this->hasCOM = false;
  this->hasCOMvel = false;
  this->hasCOMw = false;
  this->hasPressureTensor = false;
  this->hasSystemDipole = false;
  this->hasSystemQuadrupole = false;
  this->hasConvectiveHeatFlux = false;
  this->hasInertiaTensor = false;
  this->hasGyrationalVolume = false;
  this->hasHullVolume = false;
  this->hasBoundingBox = false;
  return;
}

Assistant:

void Snapshot::clearDerivedProperties() {
    frameData.totalEnergy           = 0.0;
    frameData.translationalKinetic  = 0.0;
    frameData.rotationalKinetic     = 0.0;
    frameData.electronicKinetic     = 0.0;
    frameData.kineticEnergy         = 0.0;
    frameData.potentialEnergy       = 0.0;
    frameData.shortRangePotential   = 0.0;
    frameData.longRangePotential    = 0.0;
    frameData.excludedPotential     = 0.0;
    frameData.selfPotential         = 0.0;
    frameData.pressure              = 0.0;
    frameData.temperature           = 0.0;
    frameData.pressureTensor        = Mat3x3d(0.0);
    frameData.systemDipole          = Vector3d(0.0);
    frameData.systemQuadrupole      = Mat3x3d(0.0);
    frameData.convectiveHeatFlux    = Vector3d(0.0, 0.0, 0.0);
    frameData.electronicTemperature = 0.0;
    frameData.netCharge             = 0.0;
    frameData.chargeMomentum        = 0.0;
    frameData.COM                   = V3Zero;
    frameData.COMvel                = V3Zero;
    frameData.COMw                  = V3Zero;

    hasTotalEnergy                = false;
    hasTranslationalKineticEnergy = false;
    hasRotationalKineticEnergy    = false;
    hasElectronicKineticEnergy    = false;
    hasKineticEnergy              = false;
    hasShortRangePotential        = false;
    hasLongRangePotential         = false;
    hasExcludedPotential          = false;
    hasSelfPotential              = false;
    hasPotentialEnergy            = false;
    hasXYarea                     = false;
    hasXZarea                     = false;
    hasYZarea                     = false;
    hasVolume                     = false;
    hasPressure                   = false;
    hasTemperature                = false;
    hasElectronicTemperature      = false;
    hasNetCharge                  = false;
    hasChargeMomentum             = false;
    hasCOM                        = false;
    hasCOMvel                     = false;
    hasCOMw                       = false;
    hasPressureTensor             = false;
    hasSystemDipole               = false;
    hasSystemQuadrupole           = false;
    hasConvectiveHeatFlux         = false;
    hasInertiaTensor              = false;
    hasGyrationalVolume           = false;
    hasHullVolume                 = false;
    hasBoundingBox                = false;
  }